

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_indset.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::find_indset
          (Omega_h *this,Mesh *mesh,Int ent_dim,Graph *graph,Reals *quality,
          Read<signed_char> *candidates)

{
  void *extraout_RDX;
  Read<signed_char> RVar1;
  QualityCompare local_e8;
  Read<signed_char> local_c8;
  Read<int> local_b8;
  Read<int> local_a8;
  undefined1 local_98 [24];
  QualityCompare compare;
  undefined1 local_58 [8];
  LOs adj;
  LOs xadj;
  Read<signed_char> *candidates_local;
  Reals *quality_local;
  Graph *graph_local;
  Int ent_dim_local;
  Mesh *mesh_local;
  
  Read<int>::Read((Read<int> *)&adj.write_.shared_alloc_.direct_ptr,&graph->a2ab);
  Read<int>::Read((Read<int> *)local_58,&graph->ab2b);
  QualityCompare::QualityCompare((QualityCompare *)(local_98 + 0x10));
  Read<double>::operator=((Read<double> *)(local_98 + 0x10),quality);
  Mesh::globals((Mesh *)local_98,(Int)mesh);
  Read<long>::operator=
            ((Read<long> *)&compare.quality.write_.shared_alloc_.direct_ptr,(Read<long> *)local_98);
  Read<long>::~Read((Read<long> *)local_98);
  Read<int>::Read(&local_a8,(Read<int> *)&adj.write_.shared_alloc_.direct_ptr);
  Read<int>::Read(&local_b8,(Read<int> *)local_58);
  Read<signed_char>::Read(&local_c8,candidates);
  QualityCompare::QualityCompare(&local_e8,(QualityCompare *)(local_98 + 0x10));
  indset::find<Omega_h::QualityCompare>
            ((indset *)this,mesh,ent_dim,&local_a8,&local_b8,&local_c8,&local_e8);
  QualityCompare::~QualityCompare(&local_e8);
  Read<signed_char>::~Read(&local_c8);
  Read<int>::~Read(&local_b8);
  Read<int>::~Read(&local_a8);
  QualityCompare::~QualityCompare((QualityCompare *)(local_98 + 0x10));
  Read<int>::~Read((Read<int> *)local_58);
  Read<int>::~Read((Read<int> *)&adj.write_.shared_alloc_.direct_ptr);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<I8> find_indset(
    Mesh* mesh, Int ent_dim, Graph graph, Reals quality, Read<I8> candidates) {
  auto xadj = graph.a2ab;
  auto adj = graph.ab2b;
  QualityCompare compare;
  compare.quality = quality;
  compare.global = mesh->globals(ent_dim);
  return indset::find(mesh, ent_dim, xadj, adj, candidates, compare);
}